

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

HierarchyCPT * __thiscall
despot::Parser::CreateHierarchyObsFunction(Parser *this,TiXmlElement *e_CondProb)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
  *this_00;
  NamedVar *pNVar1;
  double dVar2;
  pointer pdVar3;
  bool bVar4;
  bool condition;
  int iVar5;
  uint uVar6;
  TiXmlNode *pTVar7;
  mapped_type *ppVVar8;
  HierarchyCPT *this_01;
  TiXmlElement *pTVar9;
  char *__s;
  TiXmlElement *base;
  long lVar10;
  int i;
  ulong uVar11;
  int i_1;
  long lVar12;
  pointer pbVar13;
  allocator<char> local_271;
  TiXmlElement *local_270;
  TiXmlElement *local_268;
  Parser *local_260;
  string parent_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string local_220;
  vector<despot::StateVar,_std::allocator<despot::StateVar>_> *local_200;
  vector<double,_std::allocator<double>_> values;
  vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> parents;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parent_names;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_180;
  string name;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  string local_e8;
  _Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> local_c8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_270 = e_CondProb;
  GetFirstChildText_abi_cxx11_(&name,this,e_CondProb,"Var");
  std::__cxx11::string::string((string *)&local_108,(string *)&name);
  bVar4 = Variable::IsVariableName(&local_108,&this->obs_vars_);
  std::operator+(&parent_name,"In <ObsFunction>: Variable ",&name);
  std::operator+(&local_128,&parent_name,
                 " has not been declared as an ObsVar vname within the <Variable> tag.");
  pTVar7 = util::tinyxml::TiXmlNode::FirstChild(&local_270->super_TiXmlNode,"Var");
  Ensure(this,bVar4,&local_128,&pTVar7->super_TiXmlBase);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&parent_name);
  std::__cxx11::string::~string((string *)&local_108);
  this_00 = &this->variables_;
  ppVVar8 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
            ::operator[](this_00,&name);
  pNVar1 = (NamedVar *)*ppVVar8;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetFirstChildText_abi_cxx11_(&parent_name,this,local_270,"Parent");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220," ",(allocator<char> *)&tokens);
  Tokenize(&parent_names,&parent_name,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&parent_name);
  local_200 = &this->curr_state_vars_;
  lVar10 = 0;
  pTVar9 = (TiXmlElement *)0x0;
  local_260 = this;
  while (pTVar9 < (TiXmlElement *)
                  ((long)parent_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)parent_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    local_268 = pTVar9;
    std::__cxx11::string::string
              ((string *)&parent_name,
               (string *)
               ((long)&((parent_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10));
    std::__cxx11::string::string((string *)&local_50,(string *)&parent_name);
    bVar4 = Variable::IsVariableName(&local_50,local_200);
    condition = true;
    if (!bVar4) {
      std::__cxx11::string::string((string *)&local_148,(string *)&parent_name);
      condition = Variable::IsVariableName(&local_148,&this->action_vars_);
    }
    std::operator+(&local_220,"In <ObsFunction>: Parent ",&parent_name);
    std::operator+(&local_70,&local_220,
                   " has not been declared as a StateVar vnameCurr or an ActionVar vname within the <Variable> tag."
                  );
    pTVar7 = util::tinyxml::TiXmlNode::FirstChild(&local_270->super_TiXmlNode,"Parent");
    Ensure(local_260,condition,&local_70,&pTVar7->super_TiXmlBase);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_220);
    if (!bVar4) {
      std::__cxx11::string::~string((string *)&local_148);
    }
    std::__cxx11::string::~string((string *)&local_50);
    ppVVar8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
              ::operator[](this_00,&parent_name);
    local_220._M_dataplus._M_p = (pointer)*ppVVar8;
    std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
    emplace_back<despot::NamedVar*>
              ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&parents,
               (NamedVar **)&local_220);
    std::__cxx11::string::~string((string *)&parent_name);
    lVar10 = lVar10 + 0x20;
    pTVar9 = (TiXmlElement *)
             ((long)&(local_268->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase + 1);
  }
  this_01 = (HierarchyCPT *)operator_new(0x70);
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
            ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_180,&parents)
  ;
  HierarchyCPT::HierarchyCPT
            (this_01,pNVar1,
             (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_180);
  std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
            (&local_180);
  pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&local_270->super_TiXmlNode,"Dependency");
  pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar9->super_TiXmlNode,"Vars");
  while (pTVar9 != (TiXmlElement *)0x0) {
    __s = util::tinyxml::TiXmlElement::GetText(pTVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parent_name,__s,(allocator<char> *)&values);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220," ",(allocator<char> *)&value_tokens);
    Tokenize(&tokens,&parent_name,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&parent_name);
    pNVar1 = *parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string
              ((string *)&local_90,
               (string *)
               tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    local_268 = pTVar9;
    iVar5 = Variable::IndexOf(&pNVar1->super_Variable,&local_90);
    local_200 = (vector<despot::StateVar,_std::allocator<despot::StateVar>_> *)
                CONCAT44(local_200._4_4_,iVar5);
    std::__cxx11::string::~string((string *)&local_90);
    parent_name.field_2._M_allocated_capacity = 0;
    parent_name._M_dataplus._M_p = (pointer)0x0;
    parent_name._M_string_length = 0;
    lVar10 = 0x20;
    for (uVar11 = 1;
        uVar11 < (ulong)((long)tokens.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)tokens.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar11 = uVar11 + 1)
    {
      ppVVar8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
                ::operator[](this_00,(key_type *)
                                     ((long)&((tokens.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar10));
      local_220._M_dataplus._M_p = (pointer)*ppVVar8;
      std::vector<despot::NamedVar*,std::allocator<despot::NamedVar*>>::
      emplace_back<despot::NamedVar*>
                ((vector<despot::NamedVar*,std::allocator<despot::NamedVar*>> *)&parent_name,
                 (NamedVar **)&local_220);
      lVar10 = lVar10 + 0x20;
    }
    std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::vector
              ((vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_c8,
               (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&parent_name);
    pTVar9 = local_268;
    HierarchyCPT::SetParents
              (this_01,(int)local_200,
               (vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&local_c8);
    std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
              (&local_c8);
    pTVar9 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar9->super_TiXmlNode);
    std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
              ((_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *)&parent_name
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tokens);
  }
  pTVar9 = GetParameterElement(local_260,local_270);
  pTVar9 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar9->super_TiXmlNode,"Entry");
  while( true ) {
    if (pTVar9 == (TiXmlElement *)0x0) break;
    GetFirstChildText_abi_cxx11_(&parent_name,local_260,pTVar9,"Instance");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220," ",(allocator<char> *)&values);
    Tokenize(&tokens,&parent_name,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&parent_name);
    values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    GetFirstChildText_abi_cxx11_(&parent_name,local_260,pTVar9,"ProbTable");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220," ",&local_271);
    Tokenize(&value_tokens,&parent_name,&local_220);
    local_268 = pTVar9;
    std::__cxx11::string::~string((string *)&local_220);
    std::vector<double,_std::allocator<double>_>::resize
              (&values,(long)value_tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)value_tokens.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
    pdVar3 = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = (long)value_tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)value_tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    pbVar13 = value_tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (lVar12 = 0; lVar10 >> 5 != lVar12; lVar12 = lVar12 + 1) {
      dVar2 = atof((pbVar13->_M_dataplus)._M_p);
      pdVar3[lVar12] = dVar2;
      pbVar13 = pbVar13 + 1;
    }
    pNVar1 = *parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string
              ((string *)&local_b0,
               (string *)
               tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    uVar6 = Variable::IndexOf(&pNVar1->super_Variable,&local_b0);
    pTVar9 = local_268;
    std::__cxx11::string::~string((string *)&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&tokens,(const_iterator)
                    tokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    iVar5 = (*(this_01->super_CPT).super_Function._vptr_Function[0x12])
                      (this_01,(ulong)uVar6,&tokens,&values);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"In <ObsFunction>: Value assignment failed.",
               (allocator<char> *)&local_220);
    base = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar9->super_TiXmlNode,"Instance");
    Ensure(local_260,SUB41(iVar5,0),&local_e8,(TiXmlBase *)base);
    std::__cxx11::string::~string((string *)&local_e8);
    pTVar9 = util::tinyxml::TiXmlNode::NextSiblingElement(&pTVar9->super_TiXmlNode);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&value_tokens);
    std::__cxx11::string::~string((string *)&parent_name);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&values.super__Vector_base<double,_std::allocator<double>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tokens);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parent_names);
  std::_Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::~_Vector_base
            (&parents.super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>);
  std::__cxx11::string::~string((string *)&name);
  return this_01;
}

Assistant:

HierarchyCPT* Parser::CreateHierarchyObsFunction(TiXmlElement* e_CondProb) {
	// <Var>
	string name = GetFirstChildText(e_CondProb, "Var");

	Ensure(Variable::IsVariableName(name, obs_vars_),
		"In <ObsFunction>: Variable " + name
			+ " has not been declared as an ObsVar vname within the <Variable> tag.",
		e_CondProb->FirstChild("Var"));

	ObsVar* child = static_cast<ObsVar*>(variables_[name]);

	// <Parent>
	vector<NamedVar*> parents;
	vector<string> parent_names = Tokenize(
		GetFirstChildText(e_CondProb, "Parent"));
	for (int i = 0; i < parent_names.size(); i++) {
		string parent_name = parent_names[i];
		Ensure(
			Variable::IsVariableName(parent_name, curr_state_vars_)
				|| Variable::IsVariableName(parent_name, action_vars_),
			"In <ObsFunction>: Parent " + parent_name
				+ " has not been declared as a StateVar vnameCurr or an ActionVar vname within the <Variable> tag.",
			e_CondProb->FirstChild("Parent"));

		parents.push_back(static_cast<StateVar*>(variables_[parent_name]));
	}

	HierarchyCPT* func = new HierarchyCPT(child, parents);

	TiXmlElement* e_Dependency = GetFirstChildElement(e_CondProb, "Dependency");
	TiXmlElement* e_Vars = GetFirstChildElement(e_Dependency, "Vars");
	while (e_Vars != NULL) {
		vector<string> tokens = Tokenize(e_Vars->GetText());
		int val = parents[0]->IndexOf(tokens[0]);
		vector<NamedVar*> vars;
		for (int i = 1; i < tokens.size(); i++)
			vars.push_back(static_cast<NamedVar*>(variables_[tokens[i]]));
		func->SetParents(val, vars);

		e_Vars = e_Vars->NextSiblingElement();
	}

	// <Parameter>
	TiXmlElement* e_Parameter = GetParameterElement(e_CondProb);
	TiXmlElement* e_Entry = e_Parameter->FirstChildElement("Entry");
	while (e_Entry != NULL) {
		// <Instance>
		vector<string> instance = Tokenize(
			GetFirstChildText(e_Entry, "Instance"));

		// <ProbTable>
		vector<double> values;
		string table = GetFirstChildText(e_Entry, "ProbTable");

		vector<string> value_tokens = Tokenize(table);

		values.resize(value_tokens.size());
		for (int i = 0; i < value_tokens.size(); i++) {
			values[i] = atof(value_tokens[i].c_str());
		}

		int val = parents[0]->IndexOf(instance[0]);
		instance.erase(instance.begin());
		bool success = func->SetValue(val, instance, values);

		Ensure(success, "In <ObsFunction>: Value assignment failed.",
			GetFirstChildElement(e_Entry, "Instance"));

		e_Entry = e_Entry->NextSiblingElement();
	}

	return func;
}